

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

void Vec_IntInsert(Vec_Int_t *p,int iHere,int Entry)

{
  int iVar1;
  int local_1c;
  int i;
  int Entry_local;
  int iHere_local;
  Vec_Int_t *p_local;
  
  if ((-1 < iHere) && (iHere <= p->nSize)) {
    Vec_IntPush(p,0);
    iVar1 = p->nSize;
    while (local_1c = iVar1 + -1, iHere < local_1c) {
      p->pArray[local_1c] = p->pArray[iVar1 + -2];
      iVar1 = local_1c;
    }
    p->pArray[local_1c] = Entry;
    return;
  }
  __assert_fail("iHere >= 0 && iHere <= p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x413,"void Vec_IntInsert(Vec_Int_t *, int, int)");
}

Assistant:

static inline void Vec_IntInsert( Vec_Int_t * p, int iHere, int Entry )
{
    int i;
    assert( iHere >= 0 && iHere <= p->nSize );
    Vec_IntPush( p, 0 );
    for ( i = p->nSize - 1; i > iHere; i-- )
        p->pArray[i] = p->pArray[i-1];
    p->pArray[i] = Entry;
}